

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp.cpp
# Opt level: O0

bool send_notification(bgp_peer *peer,int8_t error,uint16_t error_sub)

{
  uint16_t uVar1;
  int iVar2;
  undefined1 local_29 [8];
  bgp_notification notification;
  uint16_t error_sub_local;
  int8_t error_local;
  bgp_peer *peer_local;
  
  notification.header.maker._13_2_ = error_sub;
  notification.header.length._0_1_ = error;
  unique0x1000007b = peer;
  memset(local_29,0xff,0x10);
  notification.header.maker._8_2_ = htons(0x13);
  notification.header.maker[10] = '\x03';
  notification.header.maker[0xb] = (uchar)notification.header.length;
  uVar1 = htons(notification.header.maker._13_2_);
  notification.header.maker[0xc] = (uchar)uVar1;
  iVar2 = (**stack0xfffffffffffffff0->_vptr_bgp_peer)(stack0xfffffffffffffff0,local_29,0x13);
  return (bool)((byte)iVar2 & 1);
}

Assistant:

bool send_notification(bgp_peer* peer, int8_t error, uint16_t error_sub){
    bgp_notification notification;
    memset(notification.header.maker, 0xff, 16);
    notification.header.length = htons(19);
    notification.header.type = NOTIFICATION;
    notification.error = error;
    notification.error_sub = htons(error_sub);
    return peer->send(&notification, 19);
}